

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndRgEa<(moira::Instr)59,(moira::Mode)7,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  long in_RDI;
  Ea<(moira::Mode)7,_(moira::Size)1> dst;
  Dn src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined6 in_stack_ffffffffffffffc8;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  Dn local_20 [4];
  StrWriter *local_10;
  
  local_10 = in_RSI;
  Dn::Dn(local_20,(int)(uint)in_CX >> 9 & 7);
  Op<(moira::Mode)7,(moira::Size)1>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,
             (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pSVar1 = StrWriter::operator<<(local_10);
  pSVar1 = StrWriter::operator<<(pSVar1);
  pSVar1 = StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI + 0x14));
  pSVar1 = StrWriter::operator<<(pSVar1,local_20[0]);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)in_stack_ffffffffffffffd0,
             (Ea<(moira::Mode)7,_(moira::Size)1> *)
             CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void
Moira::dasmAndRgEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}